

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

int get_smart_mv_prec(AV1_COMP *cpi,MV_STATS *mv_stats,int current_q)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int use_high_hp;
  float score;
  int f_idx;
  float features [18];
  float area;
  int order_diff;
  int order_hint;
  AV1_COMMON *cm;
  float local_80;
  int local_7c;
  float local_78 [19];
  float local_2c;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = in_RDI + 0x3bf80;
  local_24 = *(int *)(in_RDI + 0x3bf84);
  local_28 = local_24 - *(int *)(in_RSI + 8);
  local_2c = (float)(*(int *)(in_RDI + 0x3bfb8) * *(int *)(in_RDI + 0x3bfbc));
  local_78[0] = (float)in_EDX;
  local_78[1] = (float)*(int *)(in_RSI + 4);
  local_78[2] = (float)local_28;
  local_78[3] = (float)*(int *)(in_RSI + 0xc) / local_2c;
  local_78[4] = (float)*(int *)(in_RSI + 0x10) / local_2c;
  local_78[5] = (float)*(int *)(in_RSI + 0x14) / local_2c;
  local_78[6] = (float)*(int *)(in_RSI + 0x18) / local_2c;
  local_78[7] = (float)*(int *)(in_RSI + 0x1c) / local_2c;
  local_78[8] = (float)*(int *)(in_RSI + 0x20) / local_2c;
  local_78[9] = (float)*(int *)(in_RSI + 0x24) / local_2c;
  local_78[10] = (float)*(int *)(in_RSI + 0x28) / local_2c;
  local_78[0xb] = (float)*(int *)(in_RSI + 0x2c) / local_2c;
  local_78[0xc] = (float)*(int *)(in_RSI + 0x30) / local_2c;
  local_78[0xd] = (float)*(int *)(in_RSI + 0x34) / local_2c;
  local_78[0xe] = (float)*(int *)(in_RSI + 0x38) / local_2c;
  local_78[0xf] = (float)*(int *)(in_RSI + 0x3c) / local_2c;
  local_78[0x10] = (float)*(int *)(in_RSI + 0x40) / local_2c;
  local_78[0x11] = (float)*(int *)(in_RSI + 0x44) / local_2c;
  for (local_7c = 0; local_7c < 0x12; local_7c = local_7c + 1) {
    local_78[local_7c] =
         (local_78[local_7c] - av1_mv_prec_mean[local_7c]) / av1_mv_prec_std[local_7c];
  }
  local_80 = 0.0;
  (*av1_nn_predict)(local_78,&av1_mv_prec_dnn_config,1,&local_80);
  return (uint)(0.0 <= local_80);
}

Assistant:

static inline int get_smart_mv_prec(AV1_COMP *cpi, const MV_STATS *mv_stats,
                                    int current_q) {
  const AV1_COMMON *cm = &cpi->common;
  const int order_hint = cpi->common.current_frame.order_hint;
  const int order_diff = order_hint - mv_stats->order;
  const float area = (float)(cm->width * cm->height);
  float features[MV_PREC_FEATURE_SIZE] = {
    (float)current_q,
    (float)mv_stats->q,
    (float)order_diff,
    mv_stats->inter_count / area,
    mv_stats->intra_count / area,
    mv_stats->default_mvs / area,
    mv_stats->mv_joint_count[0] / area,
    mv_stats->mv_joint_count[1] / area,
    mv_stats->mv_joint_count[2] / area,
    mv_stats->mv_joint_count[3] / area,
    mv_stats->last_bit_zero / area,
    mv_stats->last_bit_nonzero / area,
    mv_stats->total_mv_rate / area,
    mv_stats->hp_total_mv_rate / area,
    mv_stats->lp_total_mv_rate / area,
    mv_stats->horz_text / area,
    mv_stats->vert_text / area,
    mv_stats->diag_text / area,
  };

  for (int f_idx = 0; f_idx < MV_PREC_FEATURE_SIZE; f_idx++) {
    features[f_idx] =
        (features[f_idx] - av1_mv_prec_mean[f_idx]) / av1_mv_prec_std[f_idx];
  }
  float score = 0.0f;

  av1_nn_predict(features, &av1_mv_prec_dnn_config, 1, &score);

  const int use_high_hp = score >= 0.0f;
  return use_high_hp;
}